

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_hood.h
# Opt level: O3

size_t __thiscall
robin_hood::
hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>::
operator()(hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
           *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *str)

{
  pointer pcVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  pcVar1 = (str->_M_dataplus)._M_p;
  uVar2 = str->_M_string_length;
  uVar4 = uVar2 * -0x395b586ca42e166b ^ 0xe17a1465;
  uVar3 = uVar2 >> 3;
  if (7 < uVar2) {
    uVar5 = 0;
    do {
      uVar4 = (((ulong)(*(long *)(pcVar1 + uVar5 * 8) * -0x395b586ca42e166b) >> 0x2f ^
               *(long *)(pcVar1 + uVar5 * 8) * -0x395b586ca42e166b) * -0x395b586ca42e166b ^ uVar4) *
              -0x395b586ca42e166b;
      uVar5 = uVar5 + 1;
    } while (uVar3 != uVar5);
  }
  switch((uint)uVar2 & 7) {
  case 7:
    uVar4 = uVar4 ^ (ulong)(byte)pcVar1[uVar3 * 8 + 6] << 0x30;
  case 6:
    uVar4 = uVar4 ^ (ulong)(byte)pcVar1[uVar3 * 8 + 5] << 0x28;
  case 5:
    uVar4 = uVar4 ^ (ulong)(byte)pcVar1[uVar3 * 8 + 4] << 0x20;
  case 4:
    uVar4 = uVar4 ^ (ulong)(byte)pcVar1[uVar3 * 8 + 3] << 0x18;
  case 3:
    uVar4 = uVar4 ^ (ulong)(byte)pcVar1[uVar3 * 8 + 2] << 0x10;
  case 2:
    uVar4 = uVar4 ^ (ulong)(byte)pcVar1[uVar3 * 8 + 1] << 8;
  case 1:
    uVar4 = ((byte)pcVar1[uVar3 * 8] ^ uVar4) * -0x395b586ca42e166b;
  case 0:
    uVar2 = (uVar4 >> 0x2f ^ uVar4) * -0x395b586ca42e166b;
    return uVar2 >> 0x2f ^ uVar2;
  }
}

Assistant:

size_t operator()(std::basic_string<CharT> const& str) const noexcept {
        return hash_bytes(str.data(), sizeof(CharT) * str.size());
    }